

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::MakeNamedMedium
          (FormattingParserTarget *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_RDI;
  ParameterDictionary dict;
  char *in_stack_fffffffffffffe48;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffe50;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  int extra;
  FormattingParserTarget *this_01;
  RGBColorSpace *in_stack_fffffffffffffe80;
  ParsedParameterVector *in_stack_fffffffffffffe88;
  ParameterDictionary *in_stack_fffffffffffffe90;
  string local_160 [32];
  string local_140 [4];
  int in_stack_fffffffffffffec4;
  ParameterDictionary *in_stack_fffffffffffffec8;
  string local_120 [48];
  undefined1 local_f0 [240];
  
  this_00 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)local_f0;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            (&in_stack_fffffffffffffe50->alloc);
  this_01 = (FormattingParserTarget *)(local_f0 + 8);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(this_00,in_RDX,in_RDI);
  extra = (int)((ulong)this_00 >> 0x20);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(in_stack_fffffffffffffe50);
  if ((((ulong)in_RDI[2].memoryResource & 0x100) == 0) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48), !bVar1)) {
    indent_abi_cxx11_(this_01,extra);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
    std::__cxx11::string::~string(local_160);
  }
  else {
    indent_abi_cxx11_(this_01,extra);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    Printf<std::__cxx11::string,char_const(&)[12],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88,(char (*) [12])in_stack_fffffffffffffe80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_120);
  }
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x806441);
  return;
}

Assistant:

void FormattingParserTarget::MakeNamedMedium(const std::string &name,
                                             ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade && name == "heterogeneous")
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), "uniformgrid",
               dict.ToParameterList(catIndentCount));
    else
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), name,
               dict.ToParameterList(catIndentCount));
}